

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O3

void __thiscall cmXMLWriter::ConditionalLineBreak(cmXMLWriter *this,bool condition)

{
  undefined7 in_register_00000031;
  ulong uVar1;
  char local_11;
  
  if (((int)CONCAT71(in_register_00000031,condition) != 0) &&
     (std::__ostream_insert<char,std::char_traits<char>>(this->Output,&local_11,1),
     this->Level + this->Indent != 0)) {
    uVar1 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->Output,(this->IndentationElement)._M_dataplus._M_p,
                 (this->IndentationElement)._M_string_length);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->Level + this->Indent);
  }
  return;
}

Assistant:

void cmXMLWriter::ConditionalLineBreak(bool condition)
{
  if (condition) {
    this->Output << '\n';
    for (std::size_t i = 0; i < this->Indent + this->Level; ++i) {
      this->Output << this->IndentationElement;
    }
  }
}